

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O1

Gia_Man_t * Gia_ManTransformFlops(Gia_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  int *pInitState;
  Gia_Man_t *pGVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  if (vInit->nSize != vFlops->nSize) {
    __assert_fail("Vec_IntSize(vInit) == Vec_IntSize(vFlops)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x15a,"Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar7 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  if (iVar7 == 0) {
    pInitState = (int *)0x0;
  }
  else {
    pInitState = (int *)malloc((long)iVar7 * 4);
  }
  memset(pInitState,0,(long)iVar7 << 2);
  iVar1 = vFlops->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vFlops->pArray;
    lVar8 = 0;
    do {
      iVar2 = piVar3[lVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(p->pObjs + iVar2);
      if (((~(uint)uVar4 & 0x9fffffff) != 0) ||
         (uVar6 = (uint)((ulong)uVar4 >> 0x20),
         (int)(uVar6 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                      ,0x15e,
                      "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (vInit->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vInit->pArray[lVar8] != 0) {
        uVar6 = (p->nRegs - p->vCis->nSize) + (uVar6 & 0x1fffffff);
        if (((int)uVar6 < 0) || (p->nRegs <= (int)uVar6)) {
          __assert_fail("iFlopId >= 0 && iFlopId < Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                        ,0x162,
                        "Gia_Man_t *Gia_ManTransformFlops(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar7 * 0x20 <= (int)uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        pInitState[uVar6 >> 5] = pInitState[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  pGVar5 = Gia_ManDupFlip(p,pInitState);
  if (pInitState != (int *)0x0) {
    free(pInitState);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManTransformFlops( Gia_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vInit )
{
    Vec_Bit_t * vInitNew;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iFlopId;
    assert( Vec_IntSize(vInit) == Vec_IntSize(vFlops) );
    vInitNew = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
    {
        assert( Gia_ObjIsRo(p, pObj) );
        if ( Vec_IntEntry(vInit, i) == 0 )
            continue;
        iFlopId = Gia_ObjCioId(pObj) - Gia_ManPiNum(p);
        assert( iFlopId >= 0 && iFlopId < Gia_ManRegNum(p) );
        Vec_BitWriteEntry( vInitNew, iFlopId, 1 );
    }
    pNew = Gia_ManDupFlip( p, Vec_BitArray(vInitNew) );
    Vec_BitFree( vInitNew );
    return pNew;
}